

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O1

bool google::protobuf::compiler::annotation_test_util::RunProtoCompiler
               (string *filename,string *plugin_specific_args,CommandLineInterface *cli,
               FileDescriptorProto *file)

{
  int iVar1;
  string capture_out;
  DescriptorCapturingGenerator capturing_generator;
  char *argv [5];
  string proto_path;
  string local_f8;
  CodeGenerator local_d8;
  FileDescriptorProto *local_d0;
  string local_c8;
  pointer local_a8;
  long *local_98;
  AlphaNum *local_90;
  long local_88 [2];
  undefined1 local_78 [48];
  string local_48;
  
  local_d8._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_01956d60;
  local_d0 = file;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--capture_out","");
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,anon_var_dwarf_a12c75 + 5);
  CommandLineInterface::RegisterGenerator(cli,&local_c8,&local_d8,(string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)0x2;
  local_c8._M_string_length = 0x1203b30;
  TestTempDir_abi_cxx11_();
  local_78._0_8_ = local_f8._M_string_length;
  local_78._8_8_ = local_f8._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_48,(lts_20250127 *)&local_c8,(AlphaNum *)local_78,
             (AlphaNum *)local_f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)0xe;
  local_c8._M_string_length = 0x128c5b5;
  TestTempDir_abi_cxx11_();
  local_78._0_8_ = local_90;
  local_78._8_8_ = local_98;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_f8,(lts_20250127 *)&local_c8,(AlphaNum *)local_78,local_90);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  local_c8._M_dataplus._M_p = "protoc";
  local_c8._M_string_length = (size_type)local_48._M_dataplus._M_p;
  local_c8.field_2._M_allocated_capacity = (size_type)(plugin_specific_args->_M_dataplus)._M_p;
  local_c8.field_2._8_8_ = local_f8._M_dataplus._M_p;
  local_a8 = (filename->_M_dataplus)._M_p;
  iVar1 = CommandLineInterface::Run(cli,5,(char **)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  CodeGenerator::~CodeGenerator(&local_d8);
  return iVar1 == 0;
}

Assistant:

bool RunProtoCompiler(const std::string& filename,
                      const std::string& plugin_specific_args,
                      CommandLineInterface* cli, FileDescriptorProto* file) {
  cli->SetInputsAreProtoPathRelative(true);

  DescriptorCapturingGenerator capturing_generator(file);
  cli->RegisterGenerator("--capture_out", &capturing_generator, "");

  std::string proto_path = absl::StrCat("-I", TestTempDir());
  std::string capture_out = absl::StrCat("--capture_out=", TestTempDir());

  const char* argv[] = {"protoc", proto_path.c_str(),
                        plugin_specific_args.c_str(), capture_out.c_str(),
                        filename.c_str()};

  return cli->Run(5, argv) == 0;
}